

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphMaker.cc
# Opt level: O0

__uint128_t * kmer_cannonical128(__uint128_t kmer,uint8_t k)

{
  undefined1 kmer_00 [16];
  __uint128_t *p_Var1;
  ulong extraout_RDX;
  ulong in_RSI;
  __uint128_t *in_RDI;
  __uint128_t rkmer;
  undefined8 in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  
  kmer_00._8_8_ = in_stack_ffffffffffffff80;
  kmer_00._0_8_ = in_stack_ffffffffffffff78;
  p_Var1 = kmer_reverse128(in_RDI,(__uint128_t)kmer_00,(uint8_t)in_RSI);
  if (extraout_RDX < in_RSI || extraout_RDX - in_RSI < (ulong)(p_Var1 < in_RDI)) {
    in_RDI = p_Var1;
  }
  return in_RDI;
}

Assistant:

__uint128_t kmer_cannonical128(__uint128_t kmer, uint8_t k) {
    __uint128_t rkmer=kmer_reverse128(kmer,k);
    return (rkmer<kmer ? rkmer:kmer);
}